

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_4> __thiscall tcu::normalize<float,4>(tcu *this,Vector<float,_4> *a)

{
  Type TVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  ulong extraout_XMM0_Qa;
  undefined8 uVar4;
  Vector<float,_4> VVar5;
  int local_20;
  int i;
  float ooLen;
  Vector<float,_4> *a_local;
  Vector<float,_4> *res;
  ulong uVar3;
  
  TVar1 = length<float,4>(a);
  uVar4 = CONCAT44(extraout_XMM0_Db,TVar1);
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar3 = extraout_XMM0_Qa;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    fVar2 = (1.0 / TVar1) * a->m_data[local_20];
    uVar3 = (ulong)(uint)fVar2;
    *(float *)(this + (long)local_20 * 4) = fVar2;
  }
  VVar5.m_data[2] = (float)(int)uVar4;
  VVar5.m_data[3] = (float)(int)((ulong)uVar4 >> 0x20);
  VVar5.m_data[0] = (float)(int)uVar3;
  VVar5.m_data[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector<float,_4>)VVar5.m_data;
}

Assistant:

inline Vector<T, Size> normalize (const Vector<T, Size>& a)
{
	T ooLen = T(1) / length(a);
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = ooLen * a.m_data[i];
	return res;
}